

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Class * __thiscall camp::Class::base(Class *this,size_t index)

{
  pointer pBVar1;
  OutOfRange *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  OutOfRange local_68;
  
  pBVar1 = (this->m_bases).
           super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_bases).
                            super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4)) {
    return pBVar1[index].base;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_68,index,
             (long)(this->m_bases).
                   super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_bases).
                   super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"const Class &camp::Class::base(std::size_t) const",&local_aa);
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_68,&local_88,0x38,&local_a8);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Class& Class::base(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_bases.size())
        CAMP_ERROR(OutOfRange(index, m_bases.size()));

    return *m_bases[index].base;
}